

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O2

int arkode_butcher_order5b
              (sunrealtype *b,sunrealtype *c1,sunrealtype *c2,sunrealtype **A,sunrealtype *c3,int s)

{
  int iVar1;
  sunrealtype *z;
  sunrealtype *z_00;
  sunrealtype bccAc;
  
  z = (sunrealtype *)calloc((long)s,8);
  z_00 = (sunrealtype *)calloc((long)s,8);
  iVar1 = arkode_butcher_vv(c1,c2,s,z);
  if (((iVar1 == 0) && (iVar1 = arkode_butcher_vv(b,z,s,z_00), iVar1 == 0)) &&
     (iVar1 = arkode_butcher_mv(A,c3,s,z), iVar1 == 0)) {
    iVar1 = arkode_butcher_dot(z,z_00,s,&bccAc);
    if (iVar1 != 0) {
      return 0;
    }
    free(z);
    free(z_00);
    return (uint)(ABS(bccAc + -0.1) <= 1.4901161193847656e-08);
  }
  free(z);
  free(z_00);
  return 0;
}

Assistant:

static sunbooleantype arkode_butcher_order5b(sunrealtype* b, sunrealtype* c1,
                                             sunrealtype* c2, sunrealtype** A,
                                             sunrealtype* c3, int s)
{
  sunrealtype bccAc;
  sunrealtype* tmp1 = calloc(s, sizeof(sunrealtype));
  sunrealtype* tmp2 = calloc(s, sizeof(sunrealtype));
  if (arkode_butcher_vv(c1, c2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(b, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A, c3, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_dot(tmp1, tmp2, s, &bccAc)) { return (SUNFALSE); }
  free(tmp1);
  free(tmp2);
  return (SUNRabs(bccAc - SUN_RCONST(0.1)) > TOL) ? SUNFALSE : SUNTRUE;
}